

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O2

ptTy Bezier(double t,ptTy *p0,ptTy *p1,ptTy *p2,double *pAngle)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ptTy pVar4;
  
  dVar2 = 1.0 - t;
  dVar3 = dVar2 + dVar2;
  if (pAngle != (double *)0x0) {
    dVar1 = atan2((p2->x - p1->x) * (t + t) + (p1->x - p0->x) * dVar3,
                  (p2->y - p1->y) * (t + t) + (p1->y - p0->y) * dVar3);
    *pAngle = ((double)(~-(ulong)(0.0 <= dVar1) &
                        (ulong)(dVar1 + 3.141592653589793 + 3.141592653589793) |
                       (ulong)dVar1 & -(ulong)(0.0 <= dVar1)) * 180.0) / 3.141592653589793;
  }
  pVar4.y = t * t * p2->y + dVar3 * t * p1->y + dVar2 * dVar2 * p0->y;
  pVar4.x = t * t * p2->x + dVar3 * t * p1->x + dVar2 * dVar2 * p0->x;
  return pVar4;
}

Assistant:

ptTy Bezier (double t, const ptTy& p0, const ptTy& p1, const ptTy& p2,
             double* pAngle)
{
    const double oneMt  = 1-t;
    
    // Angle wanted?
    if (pAngle) {
        // B'(t) = 2(1-t)(p1-p0)+2t(p2-p1)
        ptTy dtB = 2 * oneMt * (p1-p0) + 2 * t * (p2-p1);
        *pAngle = rad2deg360(std::atan2(dtB.x, dtB.y));
    }
    
    // We calculate the value directly, ie. without De-Casteljau
    // B(t) = (1-t)^2 p0 + 2(1+t)t p1 + t^2 p2
    return
    (oneMt*oneMt)   * p0 +              // (1-t)^2 p0 +
    (2 * oneMt * t) * p1 +              // 2(1+t)t p1 +
    (t*t)           * p2;               // t^2     p2
}